

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

bool __thiscall CCoinsViewCache::HaveInputs(CCoinsViewCache *this,CTransaction *tx)

{
  long lVar1;
  bool bVar2;
  vector<CTxIn,_std::allocator<CTxIn>_> *this_00;
  vector<CTxIn,_std::allocator<CTxIn>_> *pvVar3;
  const_reference pvVar4;
  ulong uVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  uint i;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  CTransaction *in_stack_ffffffffffffffc8;
  uint local_24;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CTransaction::IsCoinBase(in_stack_ffffffffffffffc8);
  if (!bVar2) {
    local_24 = 0;
    while( true ) {
      this_00 = (vector<CTxIn,_std::allocator<CTxIn>_> *)(ulong)local_24;
      pvVar3 = (vector<CTxIn,_std::allocator<CTxIn>_> *)
               std::vector<CTxIn,_std::allocator<CTxIn>_>::size(in_stack_ffffffffffffffb8);
      if (pvVar3 <= this_00) break;
      pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                         (this_00,CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      uVar5 = (**(code **)(*in_RDI + 8))(in_RDI,pvVar4);
      if ((uVar5 & 1) == 0) {
        local_9 = false;
        goto LAB_018f8c9f;
      }
      local_24 = local_24 + 1;
    }
  }
  local_9 = true;
LAB_018f8c9f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

bool CCoinsViewCache::HaveInputs(const CTransaction& tx) const
{
    if (!tx.IsCoinBase()) {
        for (unsigned int i = 0; i < tx.vin.size(); i++) {
            if (!HaveCoin(tx.vin[i].prevout)) {
                return false;
            }
        }
    }
    return true;
}